

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_prepare.cpp
# Opt level: O1

unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true> __thiscall
duckdb::Transformer::TransformPrepare(Transformer *this,PGPrepareStmt *stmt)

{
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> _Var1;
  undefined8 uVar2;
  Transformer *this_00;
  pointer pPVar3;
  NotImplementedException *this_01;
  long in_RDX;
  pointer *__ptr;
  allocator local_49;
  undefined1 local_48 [32];
  
  if ((*(long *)(in_RDX + 0x10) != 0) && (0 < *(int *)(*(long *)(in_RDX + 0x10) + 4))) {
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_48._0_8_ = local_48 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Prepared statement argument types are not supported, use CAST",""
              );
    NotImplementedException::NotImplementedException(this_01,(string *)local_48);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_00 = (Transformer *)operator_new(0xa0);
  PrepareStatement::PrepareStatement((PrepareStatement *)this_00);
  (this->parent).ptr = this_00;
  ::std::__cxx11::string::string((string *)local_48,*(char **)(in_RDX + 8),&local_49);
  pPVar3 = unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true>
           ::operator->((unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true>
                         *)this);
  ::std::__cxx11::string::operator=((string *)&pPVar3->name,(string *)local_48);
  if ((Transformer *)local_48._0_8_ != (Transformer *)(local_48 + 0x10)) {
    operator_delete((void *)local_48._0_8_);
  }
  TransformStatement((Transformer *)local_48,(PGNode *)stmt);
  pPVar3 = unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true>
           ::operator->((unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>,_true>
                         *)this);
  uVar2 = local_48._0_8_;
  local_48._0_8_ = (Transformer *)0x0;
  _Var1._M_head_impl =
       (pPVar3->statement).
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (pPVar3->statement).
  super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)uVar2;
  if (_Var1._M_head_impl != (SQLStatement *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_SQLStatement + 8))();
  }
  if ((Transformer *)local_48._0_8_ != (Transformer *)0x0) {
    (**(code **)(*(long *)local_48._0_8_ + 8))();
  }
  ClearParameters((Transformer *)stmt);
  return (unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>_>)
         (unique_ptr<duckdb::PrepareStatement,_std::default_delete<duckdb::PrepareStatement>_>)this;
}

Assistant:

unique_ptr<PrepareStatement> Transformer::TransformPrepare(duckdb_libpgquery::PGPrepareStmt &stmt) {
	if (stmt.argtypes && stmt.argtypes->length > 0) {
		throw NotImplementedException("Prepared statement argument types are not supported, use CAST");
	}

	auto result = make_uniq<PrepareStatement>();
	result->name = string(stmt.name);
	result->statement = TransformStatement(*stmt.query);
	ClearParameters();

	return result;
}